

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

void __thiscall
cmComputeLinkDepends::AddVarLinkEntries(cmComputeLinkDepends *this,int depender_index,char *value)

{
  cmGeneratorTarget *pcVar1;
  pointer pcVar2;
  int iVar3;
  char *__s1;
  cmGeneratorTarget *pcVar4;
  cmTargetLinkLibraryType cVar5;
  bool bVar6;
  bool bVar7;
  pointer name;
  string var;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deplist;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> actual_libs;
  value_type local_98;
  long local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> local_48;
  
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_98,value,(allocator *)&local_48);
  cmSystemTools::ExpandListArgument(&local_98.super_string,&local_68,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.super_string._M_dataplus._M_p != &local_98.super_string.field_2) {
    operator_delete(local_98.super_string._M_dataplus._M_p,
                    local_98.super_string.field_2._M_allocated_capacity + 1);
  }
  local_48.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar6 = false;
    local_70 = (ulong)(uint)depender_index * 0x30;
    cVar5 = GENERAL_LibraryType;
    name = local_68.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar3 = std::__cxx11::string::compare((char *)name);
      bVar7 = true;
      if (iVar3 == 0) {
        cVar5 = DEBUG_LibraryType;
        bVar6 = bVar7;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)name);
        if (iVar3 == 0) {
          cVar5 = OPTIMIZED_LibraryType;
          bVar6 = bVar7;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)name);
          if (iVar3 == 0) {
            cVar5 = GENERAL_LibraryType;
            bVar6 = bVar7;
          }
          else if (name->_M_string_length != 0) {
            if (!bVar6) {
              local_98.super_string._M_dataplus._M_p = (pointer)&local_98.super_string.field_2;
              pcVar2 = (name->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_98,pcVar2,pcVar2 + name->_M_string_length);
              std::__cxx11::string::append((char *)&local_98);
              __s1 = cmMakefile::GetDefinition(this->Makefile,&local_98.super_string);
              if (__s1 != (char *)0x0) {
                iVar3 = strcmp(__s1,"debug");
                if (iVar3 == 0) {
                  cVar5 = DEBUG_LibraryType;
                }
                else {
                  iVar3 = strcmp(__s1,"optimized");
                  if (iVar3 == 0) {
                    cVar5 = OPTIMIZED_LibraryType;
                  }
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98.super_string._M_dataplus._M_p != &local_98.super_string.field_2) {
                operator_delete(local_98.super_string._M_dataplus._M_p,
                                local_98.super_string.field_2._M_allocated_capacity + 1);
              }
            }
            if ((cVar5 == GENERAL_LibraryType) || (cVar5 == this->LinkType)) {
              pcVar4 = this->Target;
              if ((-1 < depender_index) &&
                 (pcVar1 = *(cmGeneratorTarget **)
                            ((long)&((this->EntryList).
                                     super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->Target + local_70),
                 pcVar1 != (cmGeneratorTarget *)0x0)) {
                pcVar4 = pcVar1;
              }
              pcVar4 = cmGeneratorTarget::FindTargetToLink(pcVar4,name);
              local_98.super_string._M_dataplus._M_p = (pointer)&local_98.super_string.field_2;
              pcVar2 = (name->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_98,pcVar2,pcVar2 + name->_M_string_length);
              local_98.Target = pcVar4;
              std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back(&local_48,&local_98);
            }
            else {
              cVar5 = GENERAL_LibraryType;
              bVar6 = false;
              if (this->OldLinkDirMode != true) goto LAB_0048407a;
              pcVar4 = this->Target;
              if ((-1 < depender_index) &&
                 (pcVar1 = *(cmGeneratorTarget **)
                            ((long)&((this->EntryList).
                                     super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->Target + local_70),
                 pcVar1 != (cmGeneratorTarget *)0x0)) {
                pcVar4 = pcVar1;
              }
              pcVar4 = cmGeneratorTarget::FindTargetToLink(pcVar4,name);
              local_98.super_string._M_dataplus._M_p = (pointer)&local_98.super_string.field_2;
              pcVar2 = (name->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_98,pcVar2,pcVar2 + name->_M_string_length);
              local_98.Target = pcVar4;
              CheckWrongConfigItem(this,&local_98);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98.super_string._M_dataplus._M_p != &local_98.super_string.field_2) {
              operator_delete(local_98.super_string._M_dataplus._M_p,
                              local_98.super_string.field_2._M_allocated_capacity + 1);
            }
            cVar5 = GENERAL_LibraryType;
            bVar6 = false;
          }
        }
      }
LAB_0048407a:
      name = name + 1;
    } while (name != local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  }
  AddLinkEntries<cmLinkItem>(this,depender_index,&local_48);
  std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void cmComputeLinkDepends::AddVarLinkEntries(int depender_index,
                                             const char* value)
{
  // This is called to add the dependencies named by
  // <item>_LIB_DEPENDS.  The variable contains a semicolon-separated
  // list.  The list contains link-type;item pairs and just items.
  std::vector<std::string> deplist;
  cmSystemTools::ExpandListArgument(value, deplist);

  // Look for entries meant for this configuration.
  std::vector<cmLinkItem> actual_libs;
  cmTargetLinkLibraryType llt = GENERAL_LibraryType;
  bool haveLLT = false;
  for (std::vector<std::string>::const_iterator di = deplist.begin();
       di != deplist.end(); ++di) {
    if (*di == "debug") {
      llt = DEBUG_LibraryType;
      haveLLT = true;
    } else if (*di == "optimized") {
      llt = OPTIMIZED_LibraryType;
      haveLLT = true;
    } else if (*di == "general") {
      llt = GENERAL_LibraryType;
      haveLLT = true;
    } else if (!di->empty()) {
      // If no explicit link type was given prior to this entry then
      // check if the entry has its own link type variable.  This is
      // needed for compatibility with dependency files generated by
      // the export_library_dependencies command from CMake 2.4 and
      // lower.
      if (!haveLLT) {
        std::string var = *di;
        var += "_LINK_TYPE";
        if (const char* val = this->Makefile->GetDefinition(var)) {
          if (strcmp(val, "debug") == 0) {
            llt = DEBUG_LibraryType;
          } else if (strcmp(val, "optimized") == 0) {
            llt = OPTIMIZED_LibraryType;
          }
        }
      }

      // If the library is meant for this link type then use it.
      if (llt == GENERAL_LibraryType || llt == this->LinkType) {
        cmLinkItem item(*di, this->FindTargetToLink(depender_index, *di));
        actual_libs.push_back(item);
      } else if (this->OldLinkDirMode) {
        cmLinkItem item(*di, this->FindTargetToLink(depender_index, *di));
        this->CheckWrongConfigItem(item);
      }

      // Reset the link type until another explicit type is given.
      llt = GENERAL_LibraryType;
      haveLLT = false;
    }
  }

  // Add the entries from this list.
  this->AddLinkEntries(depender_index, actual_libs);
}